

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stmt.cc
# Opt level: O3

unordered_set<std::shared_ptr<kratos::AssignStmt>,_std::hash<std::shared_ptr<kratos::AssignStmt>_>,_std::equal_to<std::shared_ptr<kratos::AssignStmt>_>,_std::allocator<std::shared_ptr<kratos::AssignStmt>_>_>
* kratos::filter_assignments_with_target
            (unordered_set<std::shared_ptr<kratos::AssignStmt>,_std::hash<std::shared_ptr<kratos::AssignStmt>_>,_std::equal_to<std::shared_ptr<kratos::AssignStmt>_>,_std::allocator<std::shared_ptr<kratos::AssignStmt>_>_>
             *__return_storage_ptr__,
            unordered_set<std::shared_ptr<kratos::AssignStmt>,_std::hash<std::shared_ptr<kratos::AssignStmt>_>,_std::equal_to<std::shared_ptr<kratos::AssignStmt>_>,_std::allocator<std::shared_ptr<kratos::AssignStmt>_>_>
            *stmts,Generator *target,bool lhs)

{
  _Hash_node_base *p_Var1;
  Generator *pGVar2;
  
  (__return_storage_ptr__->_M_h)._M_buckets = &(__return_storage_ptr__->_M_h)._M_single_bucket;
  (__return_storage_ptr__->_M_h)._M_bucket_count = 1;
  (__return_storage_ptr__->_M_h)._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (__return_storage_ptr__->_M_h)._M_element_count = 0;
  (__return_storage_ptr__->_M_h)._M_rehash_policy._M_max_load_factor = 1.0;
  (__return_storage_ptr__->_M_h)._M_rehash_policy._M_next_resize = 0;
  (__return_storage_ptr__->_M_h)._M_single_bucket = (__node_base_ptr)0x0;
  for (p_Var1 = (stmts->_M_h)._M_before_begin._M_nxt; p_Var1 != (_Hash_node_base *)0x0;
      p_Var1 = p_Var1->_M_nxt) {
    if (lhs) {
      pGVar2 = (Generator *)(*(code *)(p_Var1[1]._M_nxt[0x18]._M_nxt)->_M_nxt[0xd]._M_nxt)();
    }
    else {
      pGVar2 = (Generator *)(*(code *)(p_Var1[1]._M_nxt[0x19]._M_nxt)->_M_nxt[0xd]._M_nxt)();
    }
    if (pGVar2 == target) {
      std::
      _Hashtable<std::shared_ptr<kratos::AssignStmt>,std::shared_ptr<kratos::AssignStmt>,std::allocator<std::shared_ptr<kratos::AssignStmt>>,std::__detail::_Identity,std::equal_to<std::shared_ptr<kratos::AssignStmt>>,std::hash<std::shared_ptr<kratos::AssignStmt>>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
      ::_M_emplace<std::shared_ptr<kratos::AssignStmt>const&>
                ((_Hashtable<std::shared_ptr<kratos::AssignStmt>,std::shared_ptr<kratos::AssignStmt>,std::allocator<std::shared_ptr<kratos::AssignStmt>>,std::__detail::_Identity,std::equal_to<std::shared_ptr<kratos::AssignStmt>>,std::hash<std::shared_ptr<kratos::AssignStmt>>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                  *)__return_storage_ptr__,p_Var1 + 1);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::unordered_set<std::shared_ptr<AssignStmt>> filter_assignments_with_target(
    const std::unordered_set<std::shared_ptr<AssignStmt>> &stmts, const Generator *target,
    bool lhs) {
    std::unordered_set<std::shared_ptr<AssignStmt>> result;
    for (const auto &stmt : stmts) {
        if (lhs) {
            if (stmt->left()->generator() == target) result.emplace(stmt);
        } else {
            if (stmt->right()->generator() == target) result.emplace(stmt);
        }
    }
    return result;
}